

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input
          (CategoricalCrossEntropyLossLayer *this,char *value)

{
  LogMessage *other;
  allocator<char> local_71;
  string local_70;
  LogMessage local_50;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/../src/../build/format/NeuralNetwork.pb.h"
               ,0xa4b5);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,value,&local_71);
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,&local_70)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void CategoricalCrossEntropyLossLayer::set_input(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  
  input_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), ::std::string(value));
  // @@protoc_insertion_point(field_set_char:CoreML.Specification.CategoricalCrossEntropyLossLayer.input)
}